

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStream.h
# Opt level: O0

ostream * Gs::operator<<(ostream *stream,Matrix<float,_3UL,_3UL> *mat)

{
  size_t sVar1;
  long lVar2;
  float *pfVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  ostream *poVar6;
  char local_e2;
  char local_e1;
  char local_aa;
  char local_a9;
  allocator local_81;
  string local_80 [32];
  ulong local_60;
  size_t c_1;
  size_t r_1;
  ulong local_48;
  size_t r;
  size_t c;
  size_t lengths [3];
  Matrix<float,_3UL,_3UL> *mat_local;
  ostream *stream_local;
  
  for (r = 0; r < 3; r = r + 1) {
    lengths[r - 1] = 0;
    for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
      lVar2 = r - 1;
      pfVar3 = Matrix<float,_3UL,_3UL>::operator()(mat,local_48,r);
      r_1 = Details::Length<float>(pfVar3);
      puVar4 = std::max<unsigned_long>(lengths + lVar2,&r_1);
      lengths[r - 1] = *puVar4;
    }
  }
  for (c_1 = 0; c_1 < 3; c_1 = c_1 + 1) {
    if (c_1 == 0) {
      local_a9 = '/';
    }
    else {
      local_aa = '\\';
      if (c_1 != 2) {
        local_aa = '|';
      }
      local_a9 = local_aa;
    }
    std::operator<<(stream,local_a9);
    for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
      sVar1 = lengths[local_60 - 1];
      pfVar3 = Matrix<float,_3UL,_3UL>::operator()(mat,c_1,local_60);
      sVar5 = Details::Length<float>(pfVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_80,(sVar1 - sVar5) + 1,' ',&local_81);
      std::operator<<(stream,local_80);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
      pfVar3 = Matrix<float,_3UL,_3UL>::operator()(mat,c_1,local_60);
      poVar6 = (ostream *)std::ostream::operator<<(stream,*pfVar3);
      std::operator<<(poVar6,' ');
    }
    if (c_1 == 0) {
      local_e1 = '\\';
    }
    else {
      local_e2 = '/';
      if (c_1 != 2) {
        local_e2 = '|';
      }
      local_e1 = local_e2;
    }
    poVar6 = std::operator<<(stream,local_e1);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  return stream;
}

Assistant:

std::ostream& operator << (std::ostream& stream, const Matrix<T, Rows, Cols>& mat)
{
    /* Determine longest elements for each row */
    std::size_t lengths[Matrix<T, Rows, Cols>::columns];

    for (std::size_t c = 0; c < Matrix<T, Rows, Cols>::columns; ++c)
    {
        lengths[c] = 0;
        for (std::size_t r = 0; r < Matrix<T, Rows, Cols>::rows; ++r)
            lengths[c] = std::max<std::size_t>(lengths[c], Details::Length(mat(r, c)));
    }

    /* Write each row */
    for (std::size_t r = 0; r < Rows; ++r)
    {
        stream << (r == 0 ? '/' : r + 1 == Rows ? '\\' : '|');

        for (std::size_t c = 0; c < Cols; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        stream << (r == 0 ? '\\' : r + 1 == Rows ? '/' : '|')  << std::endl;
    }

    return stream;
}